

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O0

void zzMod(word *r,word *a,size_t n,word *b,size_t m,void *stack)

{
  int iVar1;
  word wVar2;
  word *b_00;
  word *a_00;
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *in_R8;
  word *in_R9;
  word *mul;
  word *divisor;
  word *divident;
  size_t i;
  word t;
  size_t shift;
  dword qhat;
  word *b_01;
  size_t in_stack_ffffffffffffff98;
  word *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  size_t w;
  word *in_stack_ffffffffffffffb0;
  word *local_28;
  
  iVar1 = wwCmp2(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98);
  if (iVar1 < 0) {
    local_28 = in_R8;
    if (in_RDX < in_R8) {
      wwSetZero(in_RDI + (long)in_RDX,(long)in_R8 - (long)in_RDX);
      local_28 = in_RDX;
    }
    wwCopy(in_RDI,in_RSI,(size_t)local_28);
  }
  else if (in_R8 == (word *)0x1) {
    wVar2 = zzModW(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                   (word)in_stack_ffffffffffffffa0);
    *in_RDI = wVar2;
  }
  else {
    b_01 = in_R9 + (long)in_RDX + 1;
    b_00 = b_01 + (long)in_R8;
    wwCopy(in_R9,in_RSI,(size_t)in_RDX);
    in_R9[(long)in_RDX] = 0;
    wwCopy(b_01,in_RCX,(size_t)in_R8);
    a_00 = (word *)u64CLZ(0x19fe25);
    wwShHi(in_stack_ffffffffffffffa0,(size_t)in_R9,(size_t)b_01);
    wwShHi(in_stack_ffffffffffffffa0,(size_t)in_R9,(size_t)b_01);
    for (; in_R8 <= in_RDX; in_RDX = (word *)((long)in_RDX + -1)) {
      if (in_R9[(long)in_RDX] == b_01[(long)in_R8 - 1]) {
        w = 0xffffffffffffffff;
      }
      else {
        w = __udivti3(in_R9[(long)in_RDX + -1],in_R9[(long)in_RDX],b_01[(long)in_R8 - 1],0);
      }
      wwCopy(b_00,b_01 + ((long)in_R8 - 2),2);
      wVar2 = zzMulW(b_00,b_00,2,w);
      b_00[2] = wVar2;
      while( true ) {
        iVar1 = wwCmp2(a_00,w,in_RDX,(size_t)in_R9);
        if (iVar1 < 1) break;
        w = w - 1;
        wVar2 = zzSub2(b_00,b_01 + ((long)in_R8 - 2),2);
        b_00[2] = b_00[2] - wVar2;
      }
      wVar2 = zzSubMulW(in_R9 + ((long)in_RDX - (long)in_R8),b_01,(size_t)in_R8,w);
      in_R9[(long)in_RDX] = in_R9[(long)in_RDX] - wVar2;
      if ((wVar2 ^ 0xffffffffffffffff) < in_R9[(long)in_RDX]) {
        wVar2 = zzAdd2(in_R9 + ((long)in_RDX - (long)in_R8),b_01,(size_t)in_R8);
        in_R9[(long)in_RDX] = wVar2 + in_R9[(long)in_RDX];
      }
    }
    wwShLo(in_RDX,(size_t)in_R9,(size_t)b_01);
    wwCopy(in_RDI,in_R9,(size_t)in_R8);
  }
  return;
}

Assistant:

void zzMod(word r[], const word a[], size_t n, const word b[], size_t m, void* stack)
{
	register dword qhat;
	register size_t shift;
	register word t;
	size_t i;
	// переменные в stack
	word* divident;		/*< нормализованное делимое (n + 1 слово) */
	word* divisor;		/*< нормализованный делитель (m слов) */
	word* mul;			/*< вспомогательное произведение (3 слова) */
	// pre
	ASSERT(wwIsValid(a, n) && wwIsValid(b, m));
	ASSERT(m > 0 && b[m - 1] > 0);
	ASSERT(a == r || wwIsDisjoint2(a, n, r, m));
	// a < b?
	if (wwCmp2(a, n, b, m) < 0)
	{
		// r <- a
		if (n < m)
			wwSetZero(r + n, m - n), m = n;
		wwCopy(r, a, m);
		return;
	}
	// делим на одноразрядное число?
	if (m == 1)
	{
		r[0] = zzModW(a, n, b[0]);
		return;
	}
	// резервируем переменные в stack
	divident = (word*)stack;
	divisor = divident + n + 1;
	mul = divisor + m;
	stack = mul + 3;
	// divident <- a
	wwCopy(divident, a, n);
	divident[n] = 0;
	// divisor <- b
	wwCopy(divisor, b, m);
	// нормализация
	shift = wordCLZ(b[m - 1]);
	wwShHi(divident, n + 1, shift);
	wwShHi(divisor, m, shift);
	// цикл по разрядам делимого
	for (i = n; i >= m; --i)
	{
		// вычислить пробное частное
		if (divident[i] == divisor[m - 1])
			t = WORD_MAX;
		else
		{
			qhat = divident[i];
			qhat <<= B_PER_W;
			qhat |= divident[i - 1];
			qhat /= divisor[m - 1];
			t = (word)qhat;
		}
		// уточнить пробное частное
		wwCopy(mul, divisor + m - 2, 2);
		mul[2] = zzMulW(mul, mul, 2, t);
		while (wwCmp2(mul, 3, divident + i - 2, 3) > 0)
		{
			t--;
			mul[2] -= zzSub2(mul, divisor + m - 2, 2);
		}
		// учесть пробное частное
		t = zzSubMulW(divident + i - m, divisor, m, t);
		divident[i] -= t;
		if (divident[i] > (word)~t)
			// корректирующее сложение
			divident[i] += zzAdd2(divident + i - m, divisor, m);
	}
	// денормализация
	wwShLo(divident, n + 1, shift);
	// сохранить остаток
	wwCopy(r, divident, m);
	// очистить регистровые переменные
	t = 0, shift = 0, qhat = 0;
}